

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O1

ZyanStatus
ZydisFormatterFormatInstruction
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count,char *buffer,ZyanUSize length,
          ZyanU64 runtime_address,void *user_data)

{
  ZyanStatus ZVar1;
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_88;
  ZydisFormatterBuffer local_60;
  
  ZVar1 = 0x80100004;
  if (instruction != (ZydisDecodedInstruction *)0x0 && formatter != (ZydisFormatter *)0x0) {
    if ((((operand_count < 0xb) && (operands != (ZydisDecodedOperand *)0x0 || operand_count == '\0')
         ) && (length != 0)) &&
       ((buffer != (char *)0x0 && (instruction->operand_count_visible <= operand_count)))) {
      local_60.is_token_list = '\0';
      local_60.capacity = 0;
      local_60.string.flags = '\x01';
      local_60.string.vector.allocator = (ZyanAllocator *)0x0;
      local_60.string.vector.growth_factor = '\x01';
      local_60.string.vector.shrink_threshold = '\0';
      local_60.string.vector.destructor = (ZyanMemberProcedure)0x0;
      local_60.string.vector.element_size = 1;
      local_60.string.vector.size = 1;
      *buffer = '\0';
      local_88.runtime_address = runtime_address;
      local_88.operand = (ZydisDecodedOperand *)0x0;
      local_88.user_data = user_data;
      local_88.instruction = instruction;
      local_88.operands = operands;
      local_60.string.vector.capacity = length;
      local_60.string.vector.data = buffer;
      if ((((formatter->func_pre_instruction == (ZydisFormatterFunc)0x0) ||
           (ZVar1 = (*formatter->func_pre_instruction)(formatter,&local_60,&local_88),
           -1 < (int)ZVar1)) &&
          (ZVar1 = (*formatter->func_format_instruction)(formatter,&local_60,&local_88),
          -1 < (int)ZVar1)) &&
         ((formatter->func_post_instruction == (ZydisFormatterFunc)0x0 ||
          (ZVar1 = (*formatter->func_post_instruction)(formatter,&local_60,&local_88),
          -1 < (int)ZVar1)))) {
        ZVar1 = 0x100000;
      }
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterFormatInstruction(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operands,
    ZyanU8 operand_count, char* buffer, ZyanUSize length, ZyanU64 runtime_address, void* user_data)
{
    if (!formatter || !instruction || (operand_count && !operands) ||
        (operand_count > ZYDIS_MAX_OPERAND_COUNT) ||
        (operand_count < instruction->operand_count_visible) || !buffer || (length == 0))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInit(&formatter_buffer, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = operands;
    context.runtime_address = runtime_address;
    context.operand         = ZYAN_NULL;
    context.user_data       = user_data;

    if (formatter->func_pre_instruction)
    {
        ZYAN_CHECK(formatter->func_pre_instruction(formatter, &formatter_buffer, &context));
    }

    ZYAN_CHECK(formatter->func_format_instruction(formatter, &formatter_buffer, &context));

    if (formatter->func_post_instruction)
    {
        ZYAN_CHECK(formatter->func_post_instruction(formatter, &formatter_buffer, &context));
    }

    return ZYAN_STATUS_SUCCESS;
}